

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_current_path(void)

{
  char *pcVar1;
  
  pcVar1 = getcwd(g_current_path,0x104);
  if (g_verbose == true) {
    set_current_path_cold_1();
  }
  if (pcVar1 == (char *)0x0) {
    memset(g_current_path,0,0x104);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool get_current_path(char *path)
{
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(__MINGW32__)
	char *p = _getcwd(path, MAX_PATH);
	return p != NULL;
#else
	char *p = getcwd(path, MAX_PATH);
	return p != NULL;
#endif
}